

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall t_perl_generator::generate_enum(t_perl_generator *this,t_enum *tenum)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  _Alloc_hider _Var3;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_50;
  
  poVar2 = std::operator<<((ostream *)&this->f_types_,"package ");
  perl_namespace_abi_cxx11_(&local_50,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_50,&tenum->constants_
            );
  for (_Var3._M_p = local_50._M_dataplus._M_p; _Var3._M_p != (pointer)local_50._M_string_length;
      _Var3._M_p = _Var3._M_p + 8) {
    iVar1 = *(int *)(*(long *)_Var3._M_p + 0x80);
    poVar2 = std::operator<<((ostream *)&this->f_types_,"use constant ");
    poVar2 = std::operator<<(poVar2,(string *)(*(long *)_Var3._M_p + 0x60));
    poVar2 = std::operator<<(poVar2," => ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            ((_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_50);
  return;
}

Assistant:

void t_perl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "package " << perl_namespace(program_) << tenum->get_name() << ";" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    f_types_ << "use constant " << (*c_iter)->get_name() << " => " << value << ";" << endl;
  }
}